

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Node __thiscall trieste::detail::Make::done(Make *this)

{
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *__r;
  NodeDef *this_00;
  Make *pMVar1;
  runtime_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Make *in_RSI;
  Node NVar2;
  allocator<char> local_89;
  Make *local_88;
  undefined1 local_80 [80];
  
  local_88 = this;
  term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
  __r = (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10);
  while (pMVar1 = local_88,
        this_00 = (in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, this_00->parent_ != (NodeDef *)0x0) {
    Location::Location((Location *)(local_80 + 0x30),&this_00->location_);
    std::__cxx11::string::string<std::allocator<char>>((string *)__r,"this is unclosed",&local_89);
    make_error((Make *)local_80,(Location *)in_RSI,(string *)(local_80 + 0x30));
    NodeDef::push_back(this_00,(Node *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    std::__cxx11::string::~string((string *)__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x38));
    term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
    std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<trieste::NodeDef,void>
              ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)__r,
               (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
               ((in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->parent_);
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(in_RSI->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>,__r)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x18));
    term(in_RSI,(initializer_list<trieste::Token>)ZEXT816(0));
  }
  if (this_00 ==
      (in_RSI->top).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)in_RSI);
    NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pMVar1;
    return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"malformed AST");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Node done()
      {
        term();

        while (node->parent())
        {
          node->push_back(make_error(node->location(), "this is unclosed"));
          term();
          node = node->parent()->shared_from_this();
          term();
        }

        if (node != top)
          throw std::runtime_error("malformed AST");

        return top;
      }